

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O2

void SVRG::update_inner(svrg *s,example *ec)

{
  float pred;
  update u;
  update local_28;
  
  local_28.g_scalar_inner = gradient_scalar(s,ec,(ec->pred).scalar);
  pred = predict_stable(s,ec);
  local_28.g_scalar_stable = gradient_scalar(s,ec,pred);
  local_28.eta = s->all->eta;
  local_28.norm = (float)s->stable_grad_count;
  GD::foreach_feature<SVRG::update,_float_&,_&SVRG::update_inner_feature>(s->all,ec,&local_28);
  return;
}

Assistant:

void update_inner(const svrg& s, example& ec)
{
  update u;
  // |ec| already has prediction according to inner weights.
  u.g_scalar_inner = gradient_scalar(s, ec, ec.pred.scalar);
  u.g_scalar_stable = gradient_scalar(s, ec, predict_stable(s, ec));
  u.eta = s.all->eta;
  u.norm = (float)s.stable_grad_count;
  GD::foreach_feature<update, update_inner_feature>(*s.all, ec, u);
}